

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O1

void * log_map_get(log_map map,char *key)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  char *pcVar4;
  log_map_bucket_conflict plVar5;
  
  uVar2 = 0x811c9dc5;
  cVar3 = *key;
  if (cVar3 != '\0') {
    pcVar4 = key + 1;
    do {
      uVar2 = (long)cVar3 ^ uVar2 * 0x1000193;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  plVar5 = (map->table).data;
  uVar2 = (map->table).size - 1 & uVar2;
  if (plVar5[uVar2].key != (char *)0x0) {
    plVar5 = plVar5 + uVar2;
    do {
      iVar1 = strcmp(plVar5->key,key);
      if (iVar1 == 0) {
        return plVar5->value;
      }
      plVar5 = plVar5->next;
    } while (plVar5 != (log_map_bucket)0x0);
  }
  return (void *)0x0;
}

Assistant:

const void *log_map_get(log_map map, const char *key)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket bucket = &map->table.data[hash];

	if (bucket->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				return bucket->value;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	return NULL;
}